

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutil_posix.cpp
# Opt level: O0

bool getFileAttributes(char *path,uint64_t *mtime,uint64_t *size)

{
  int iVar1;
  __off_t *in_RDX;
  __time_t *in_RSI;
  char *in_RDI;
  stat st;
  stat local_b0;
  __off_t *local_20;
  __time_t *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar1 = stat(in_RDI,&local_b0);
  if (iVar1 == 0) {
    *local_18 = local_b0.st_mtim.tv_sec;
    *local_20 = local_b0.st_size;
  }
  return iVar1 == 0;
}

Assistant:

bool getFileAttributes(const char* path, uint64_t* mtime, uint64_t* size)
{
	struct stat st;

	if (stat(path, &st) == 0)
	{
		*mtime = st.st_mtime;
		*size = st.st_size;
		return true;
	}

	return false;
}